

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall Key_NewLinesAreNotAllowed3_Test::TestBody(Key_NewLinesAreNotAllowed3_Test *this)

{
  AssertionResult gtest_ar;
  parser_error_t *e;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1e0 [8];
  events_aggregator_t handler;
  allocator local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream input;
  Key_NewLinesAreNotAllowed3_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"key =\n 123",&local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)local_1e0);
  loltoml::v_0_1_1::parse<events_aggregator_t>
            ((istream *)local_190,(events_aggregator_t *)local_1e0);
  testing::Message::Message(&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1f0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/key.cpp"
             ,0x65,"Failed");
  testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
  testing::internal::AssertHelper::~AssertHelper(&local_1f0);
  testing::Message::~Message(&local_1e8);
  events_aggregator_t::~events_aggregator_t((events_aggregator_t *)local_1e0);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

TEST(Key, NewLinesAreNotAllowed3) {
    std::istringstream input("key =\n 123");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(5, e.offset());
    }
}